

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::ComputeAofs
          (NavierStokesBase *this,int comp,int ncomp,MultiFab *S,int S_comp,MultiFab *forcing_term,
          MultiFab *divu,bool is_velocity,Real dt)

{
  DistributionMapping *pDVar1;
  string redistribution_type;
  string redistribution_type_00;
  pointer pAVar2;
  bool bVar3;
  int iVar4;
  BoxArray *pBVar5;
  FluxRegister *this_00;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  MultiFab *pMVar9;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs;
  int d;
  string *this_01;
  int d_1;
  uint uVar10;
  MultiFab *pMVar11;
  BCRec *pBVar12;
  Real local_9e8;
  Vector<int,_std::allocator<int>_> iconserv_h;
  undefined8 local_9c0;
  undefined8 local_9b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_9b0;
  DeviceVector<int> iconserv;
  string local_978 [32];
  string local_958 [32];
  MultiFab local_938 [6];
  
  iconserv.m_capacity = 0;
  iconserv.m_data = (pointer)0x0;
  iconserv.m_size = 0;
  iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ = 0;
  amrex::PODVector<int,_std::allocator<int>_>::resize(&iconserv,(long)ncomp,(int *)local_938);
  local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ = 0;
  pMVar9 = local_938;
  std::vector<int,_std::allocator<int>_>::resize
            (&iconserv_h.super_vector<int,_std::allocator<int>_>,(long)ncomp,
             (value_type_conflict *)pMVar9);
  pAVar2 = advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
           super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < ncomp) {
    uVar7 = (ulong)(uint)ncomp;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar6] =
         (uint)(pAVar2[(long)comp + uVar6] == Conservative);
  }
  if ((long)iconserv_h.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      - (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 0) {
    memcpy(iconserv.m_data,
           iconserv_h.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
           (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start);
  }
  lVar8 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + 0x180;
  } while (lVar8 != 0x480);
  lVar8 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + 0x180;
  } while (lVar8 != 0x480);
  pDVar1 = &(this->super_AmrLevel).dmap;
  pMVar11 = local_938 + 3;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pBVar5 = amrex::AmrLevel::getEdgeBoxArray(&this->super_AmrLevel,(int)lVar8);
    local_9c0 = 1;
    vStack_9b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_9b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9b8 = 0;
    vStack_9b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uVar10 = ncomp;
    (*(pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar9,pBVar5,pDVar1,(ulong)(uint)ncomp,0,&local_9c0,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_9b0);
    local_9c0 = 1;
    vStack_9b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_9b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9b8 = 0;
    vStack_9b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (*(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar11,pBVar5,pDVar1,(ulong)(uint)ncomp,0,&local_9c0,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_9b0);
    pMVar11 = pMVar11 + 1;
    pMVar9 = pMVar9 + 1;
    ncomp = uVar10;
  }
  bcs = &this->m_bcrec_scalars;
  if (is_velocity) {
    bcs = &this->m_bcrec_velocity;
  }
  lVar8 = 0xbe0;
  if (is_velocity) {
    lVar8 = 0xbc8;
  }
  bVar3 = std::operator==(&advection_scheme_abi_cxx11_,"BDS");
  if (bVar3 && !is_velocity) {
    pMVar9 = this->u_mac;
    BDS::ComputeAofs(this->aofs,comp,ncomp,S,S_comp,pMVar9,pMVar9 + 1,pMVar9 + 2,local_938 + 3,
                     local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                     forcing_term,0,divu,
                     *(BCRec **)
                      ((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18),
                     &(this->super_AmrLevel).geom,&iconserv_h,dt,false);
    goto LAB_003322a3;
  }
  bVar3 = std::operator==(&advection_scheme_abi_cxx11_,"Godunov_PLM");
  if (bVar3) {
LAB_00331fe8:
    bVar3 = amrex::EBFArrayBoxFactory::isAllRegular
                      ((EBFArrayBoxFactory *)
                       (this->super_AmrLevel).m_factory._M_t.
                       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                       _M_head_impl);
    if (bVar3) {
      bVar3 = std::operator==(&advection_scheme_abi_cxx11_,"Godunov_PPM");
      pMVar9 = this->u_mac;
      Godunov::ComputeAofs
                (this->aofs,comp,ncomp,S,S_comp,pMVar9,pMVar9 + 1,pMVar9 + 2,local_938 + 3,
                 local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                 forcing_term,0,divu,
                 *(BCRec **)
                  ((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18),
                 &(this->super_AmrLevel).geom,&iconserv_h,dt,bVar3,godunov_use_forces_in_trans,
                 is_velocity);
      goto LAB_003322a3;
    }
    pMVar9 = this->u_mac;
    pMVar11 = this->aofs;
    pBVar12 = *(BCRec **)((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18);
    std::__cxx11::string::string(local_958,(string *)&redistribution_type_abi_cxx11_);
    this_01 = local_958;
    redistribution_type._M_string_length._0_4_ = ncomp;
    redistribution_type._M_dataplus._M_p = (pointer)this_01;
    redistribution_type._M_string_length._4_4_ = comp;
    redistribution_type.field_2._M_allocated_capacity = (size_type)(local_938 + 4);
    redistribution_type.field_2._8_8_ = pBVar12;
    EBGodunov::ComputeAofs
              (pMVar11,comp,ncomp,S,S_comp,pMVar9,pMVar9 + 1,pMVar9 + 2,local_938 + 3,local_938 + 4,
               local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,forcing_term,0,divu,bcs
               ,pBVar12,&(this->super_AmrLevel).geom,&iconserv_h,dt,is_velocity,redistribution_type)
    ;
  }
  else {
    bVar3 = std::operator==(&advection_scheme_abi_cxx11_,"Godunov_PPM");
    if (bVar3) goto LAB_00331fe8;
    bVar3 = std::operator==(&advection_scheme_abi_cxx11_,"BDS");
    if (bVar3 && is_velocity) goto LAB_00331fe8;
    bVar3 = std::operator==(&advection_scheme_abi_cxx11_,"MOL");
    if (!bVar3) {
      amrex::Abort_host("NSB::ComputeAofs: Unknown advection_scheme");
      goto LAB_003322a3;
    }
    bVar3 = amrex::EBFArrayBoxFactory::isAllRegular
                      ((EBFArrayBoxFactory *)
                       (this->super_AmrLevel).m_factory._M_t.
                       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                       _M_head_impl);
    pMVar9 = this->u_mac;
    pMVar11 = this->aofs;
    if (bVar3) {
      MOL::ComputeAofs(pMVar11,comp,ncomp,S,S_comp,pMVar9,pMVar9 + 1,pMVar9 + 2,local_938 + 3,
                       local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                       divu,bcs,*(BCRec **)
                                 ((long)(this->super_AmrLevel).geom.super_CoordSys.offset +
                                 lVar8 + -0x18),&iconserv,&(this->super_AmrLevel).geom,is_velocity);
      goto LAB_003322a3;
    }
    pBVar12 = *(BCRec **)((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar8 + -0x18);
    std::__cxx11::string::string(local_978,(string *)&redistribution_type_abi_cxx11_);
    this_01 = local_978;
    redistribution_type_00._M_string_length._0_4_ = ncomp;
    redistribution_type_00._M_dataplus._M_p = (pointer)this_01;
    redistribution_type_00._M_string_length._4_4_ = comp;
    redistribution_type_00.field_2._M_allocated_capacity = (size_type)(local_938 + 4);
    redistribution_type_00.field_2._8_8_ = pBVar12;
    EBMOL::ComputeAofs(pMVar11,comp,ncomp,S,S_comp,pMVar9,pMVar9 + 1,pMVar9 + 2,local_938 + 3,
                       local_938 + 4,local_938 + 5,0,false,local_938,local_938 + 1,local_938 + 2,0,
                       divu,bcs,pBVar12,&iconserv,&(this->super_AmrLevel).geom,dt,is_velocity,
                       redistribution_type_00);
  }
  std::__cxx11::string::~string(this_01);
LAB_003322a3:
  if (do_reflux != 0) {
    iVar4 = (this->super_AmrLevel).level;
    if (0 < iVar4) {
      pMVar9 = local_938;
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        amrex::FluxRegister::FineAdd(this->advflux_reg,pMVar9,(int)lVar8,0,comp,ncomp,dt);
        pMVar9 = pMVar9 + 1;
      }
      iVar4 = (this->super_AmrLevel).level;
    }
    if (iVar4 < *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.
                         super_AmrInfo.field_0x8c) {
      local_9e8 = -dt;
      pMVar9 = local_938;
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        this_00 = getAdvFluxReg(this,(this->super_AmrLevel).level + 1);
        amrex::FluxRegister::CrseInit(this_00,pMVar9,(int)lVar8,0,comp,ncomp,local_9e8,COPY);
        pMVar9 = pMVar9 + 1;
      }
    }
  }
  lVar8 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + -0x180;
  } while (lVar8 != -0x180);
  lVar8 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_938[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar8));
    lVar8 = lVar8 + -0x180;
  } while (lVar8 != -0x180);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&iconserv_h);
  amrex::PODVector<int,_std::allocator<int>_>::~PODVector(&iconserv);
  return;
}

Assistant:

void
NavierStokesBase::ComputeAofs ( int comp, int ncomp,
                                MultiFab const& S,
                                int S_comp,
                                MultiFab const& forcing_term,
                                MultiFab const& divu,
                                bool is_velocity, Real dt )
{

    // Advection type conservative or non?
    amrex::Gpu::DeviceVector<int> iconserv;
    Vector<int> iconserv_h;
    iconserv.resize(ncomp, 0);
    iconserv_h.resize(ncomp, 0);
    for (int i = 0; i < ncomp; ++i) {
        iconserv_h[i] = (advectionType[comp+i] == Conservative) ? 1 : 0;
    }
    Gpu::copy(Gpu::hostToDevice,iconserv_h.begin(),iconserv_h.end(), iconserv.begin());

    MultiFab cfluxes[AMREX_SPACEDIM];
    MultiFab edgestate[AMREX_SPACEDIM];

    //
    // Advection needs S to have 2-3 ghost cells.
    // Advection routines call slopes on cells i & i+1, and then
    // 2nd order slopes use i+/-1 => S needs 2 ghost cells (MOL)
    // 4th order slopes use i+/-2 => S needs 3 ghost cells (Godunov)
    //
    int nghost = 0;
    for (int i = 0; i < AMREX_SPACEDIM; ++i)
    {
        const BoxArray& ba = getEdgeBoxArray(i);
        cfluxes[i].define(ba, dmap, ncomp, nghost, MFInfo(), Factory());
        edgestate[i].define(ba, dmap, ncomp, nghost, MFInfo(), Factory());
    }

    auto const& bcrec_h = is_velocity? m_bcrec_velocity   : m_bcrec_scalars;
    auto const& bcrec_d = is_velocity? m_bcrec_velocity_d : m_bcrec_scalars_d;

    //
    // >>>>>>>>>>>>>>>>>>>>>>>>>>>  BDS ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
    //
    if (advection_scheme == "BDS" && (!is_velocity))
    {
        BDS::ComputeAofs(*aofs, comp, ncomp,
                         S, S_comp,
                         AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                         AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                         0, false,
                         AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]),
                         0, forcing_term, 0, divu, bcrec_d.dataPtr(),
                         geom, iconserv_h, dt, is_velocity);
    }
    else if (advection_scheme == "Godunov_PLM" || advection_scheme == "Godunov_PPM" || (advection_scheme == "BDS" && is_velocity) )
    {
        //
        // >>>>>>>>>>>>>>>>>>>>>>>>>>>  Godunov ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
        //
#ifdef AMREX_USE_EB
        if (!EBFactory().isAllRegular())
        {
            EBGodunov::ComputeAofs(*aofs, comp, ncomp,
                                    S, S_comp,
                                    AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                    AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                                    0, false,
                                    AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                                    forcing_term, 0, divu,
                                    bcrec_h, bcrec_d.dataPtr(),
                                    geom, iconserv_h, dt, is_velocity, redistribution_type);
        }
        else
#endif
        {
            bool godunov_use_ppm = ( advection_scheme == "Godunov_PPM" ? true : false );

            Godunov::ComputeAofs(*aofs, comp, ncomp,
                                 S, S_comp,
                                 AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                 AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                                 0, false,
                                 AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]),
                                 0, forcing_term, 0, divu, bcrec_d.dataPtr(),
                                 geom, iconserv_h, dt,
                                 godunov_use_ppm, godunov_use_forces_in_trans, is_velocity);
        }
    }
    else if ( advection_scheme == "MOL" )
    {
        
        //
        // >>>>>>>>>>>>>>>>>>>>>>>>>>>  MOL ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
        //
#ifdef AMREX_USE_EB
        if (!EBFactory().isAllRegular())
        {
            EBMOL::ComputeAofs(*aofs, comp, ncomp,
                               S, S_comp,
                               D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                               D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                               D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                               divu,
                               bcrec_h, bcrec_d.dataPtr(), iconserv,
                               geom, dt, is_velocity, redistribution_type );
        }
        else
#endif
        {
            MOL::ComputeAofs(*aofs, comp, ncomp,
                             S, S_comp,
                             D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                             D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                             D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                             divu,
                             bcrec_h, bcrec_d.dataPtr(), iconserv,
                             geom, is_velocity );
        }
    }
    else
    {
        Abort("NSB::ComputeAofs: Unknown advection_scheme");
    }

    if (do_reflux)
    {
        if (level > 0 )
        {
            for (int d = 0; d < AMREX_SPACEDIM; d++) {
                advflux_reg->FineAdd(cfluxes[d],d,0,comp,ncomp,dt);
            }
        }

        if (level < parent->finestLevel())
        {
            for (int d = 0; d < AMREX_SPACEDIM; d++) {
                getAdvFluxReg(level+1).CrseInit(cfluxes[d],d,0,comp,ncomp,-dt);
            }
        }
    }

}